

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ListOverlay.cpp
# Opt level: O1

bool __thiscall cursespp::ListOverlay::KeyPress(ListOverlay *this,string *key)

{
  _Manager_type p_Var1;
  pointer pcVar2;
  OverlayStack *this_00;
  bool bVar3;
  int iVar4;
  size_t index;
  ListWindow *sender;
  ListOverlay *local_70;
  shared_ptr<cursespp::IScrollAdapter> local_68;
  unsigned_long local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  p_Var1 = (this->keyInterceptorCallback).super__Function_base._M_manager;
  if (p_Var1 == (_Manager_type)0x0) {
    bVar3 = false;
  }
  else {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    pcVar2 = (key->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,pcVar2,pcVar2 + key->_M_string_length);
    if ((this->keyInterceptorCallback).super__Function_base._M_manager == (_Manager_type)0x0) {
      local_70 = this;
      std::__throw_bad_function_call();
    }
    local_70 = this;
    bVar3 = (*(this->keyInterceptorCallback)._M_invoker)
                      ((_Any_data *)&this->keyInterceptorCallback,&local_70,&local_50);
  }
  if ((p_Var1 != (_Manager_type)0x0) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2)) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (bVar3 != false) {
    return true;
  }
  iVar4 = std::__cxx11::string::compare((char *)key);
  if (iVar4 == 0) {
    this_00 = (this->super_OverlayBase).stack;
    if (this_00 == (OverlayStack *)0x0) {
      return true;
    }
    OverlayStack::Remove(this_00,&(this->super_OverlayBase).super_LayoutBase.super_ILayout);
    (*(this->super_OverlayBase).super_LayoutBase.super_Window.super_IWindow.super_IOrderable.
      _vptr_IOrderable[0x4e])(this);
    return true;
  }
  sender = (ListWindow *)0x18d391;
  iVar4 = std::__cxx11::string::compare((char *)key);
  if (iVar4 != 0) {
    iVar4 = std::__cxx11::string::compare((char *)key);
    if (((iVar4 != 0) && (iVar4 = std::__cxx11::string::compare((char *)key), iVar4 != 0)) ||
       ((this->deleteKeyCallback).super__Function_base._M_manager == (_Manager_type)0x0)) {
      bVar3 = LayoutBase::KeyPress((LayoutBase *)this,key);
      return bVar3;
    }
    local_68.super___shared_ptr<cursespp::IScrollAdapter,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (this->adapter).super___shared_ptr<cursespp::IScrollAdapter,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr;
    local_68.super___shared_ptr<cursespp::IScrollAdapter,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (this->adapter).super___shared_ptr<cursespp::IScrollAdapter,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi;
    if (local_68.super___shared_ptr<cursespp::IScrollAdapter,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_68.super___shared_ptr<cursespp::IScrollAdapter,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_68.super___shared_ptr<cursespp::IScrollAdapter,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_68.super___shared_ptr<cursespp::IScrollAdapter,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_68.super___shared_ptr<cursespp::IScrollAdapter,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    local_58 = (**(code **)(*(long *)&(((this->listWindow).
                                        super___shared_ptr<cursespp::ListOverlay::CustomListWindow,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr)->super_ListWindow).super_ScrollableWindow.
                                      super_Window.super_IWindow.super_IOrderable + 0x228))();
    if ((this->deleteKeyCallback).super__Function_base._M_manager != (_Manager_type)0x0) {
      local_70 = this;
      (*(this->deleteKeyCallback)._M_invoker)
                ((_Any_data *)&this->deleteKeyCallback,&local_70,&local_68,&local_58);
      if (local_68.super___shared_ptr<cursespp::IScrollAdapter,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        return true;
      }
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_68.super___shared_ptr<cursespp::IScrollAdapter,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
      return true;
    }
    local_70 = this;
    std::__throw_bad_function_call();
  }
  index = (**(code **)(*(long *)&(((this->listWindow).
                                   super___shared_ptr<cursespp::ListOverlay::CustomListWindow,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr)->super_ListWindow).super_ScrollableWindow.super_Window.
                                 super_IWindow.super_IOrderable + 0x228))();
  OnListEntryActivated(this,sender,index);
  return true;
}

Assistant:

bool ListOverlay::KeyPress(const std::string& key) {
    if (keyInterceptorCallback && keyInterceptorCallback(this, key)) {
        return true;
    }
    else if (key == "^[") { /* esc closes */
        this->Dismiss();
        return true;
    }
    else if (key == " ") { /* space bar also toggles activation */
        this->OnListEntryActivated(
            this->listWindow.get(),
            this->listWindow->GetSelectedIndex());
        return true;
    }
    else if (key == "KEY_BACKSPACE" || key == "KEY_DC") {
        if (deleteKeyCallback) {
            deleteKeyCallback(
                this,
                this->adapter,
                listWindow->GetSelectedIndex());

            return true;
        }
    }

    return LayoutBase::KeyPress(key);
}